

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledInputFile::readTiles
          (TiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this_00;
  int dy1_00;
  int dx1_00;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  bVar1 = isValidLevel(this,lx,ly);
  if (bVar1) {
    dx1_00 = dx2;
    if (dx1 < dx2) {
      dx1_00 = dx1;
    }
    if (dx2 < dx1) {
      dx2 = dx1;
    }
    dy1_00 = dy2;
    if (dy1 < dy2) {
      dy1_00 = dy1;
    }
    if (dy2 < dy1) {
      dy2 = dy1;
    }
    Data::readTiles((this->_data).
                    super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,dx1_00,dx2,dy1_00,dy2,lx,ly);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_1a8,"Level coordinate (");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,lx);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,ly);
  std::operator<<(poVar2,") is invalid.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledInputFile::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");

        if (dx1 > dx2) std::swap (dx1, dx2);
        if (dy1 > dy2) std::swap (dy1, dy2);

        _data->readTiles (dx1, dx2, dy1, dy2, lx, ly);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading pixel data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}